

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void breakstat(LexState *ls)

{
  FuncState *fs;
  int l2;
  byte bVar1;
  BlockCnt *pBVar2;
  
  fs = ls->fs;
  bVar1 = 0;
  for (pBVar2 = fs->bl; pBVar2 != (BlockCnt *)0x0; pBVar2 = pBVar2->previous) {
    if (pBVar2->isbreakable != '\0') goto LAB_0011093e;
    bVar1 = bVar1 | pBVar2->upval;
  }
  luaX_syntaxerror(ls,"no loop to break");
LAB_0011093e:
  if (bVar1 != 0) {
    luaK_codeABC(fs,OP_CLOSE,(uint)pBVar2->nactvar,0,0);
  }
  l2 = luaK_jump(fs);
  luaK_concat(fs,&pBVar2->breaklist,l2);
  return;
}

Assistant:

static void breakstat (LexState *ls) {
  FuncState *fs = ls->fs;
  BlockCnt *bl = fs->bl;
  int upval = 0;
  while (bl && !bl->isbreakable) {
    upval |= bl->upval;
    bl = bl->previous;
  }
  if (!bl)
    luaX_syntaxerror(ls, "no loop to break");
  if (upval)
    luaK_codeABC(fs, OP_CLOSE, bl->nactvar, 0, 0);
  luaK_concat(fs, &bl->breaklist, luaK_jump(fs));
}